

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

uint collapse_challenge(uint8_t *collapsed,uint num_rounds,uint8_t *challenge)

{
  long in_RDX;
  uint in_ESI;
  uint i;
  bitstream_t bs;
  uint local_2c;
  bitstream_t local_28;
  long local_18;
  uint local_c;
  
  local_28.position = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  for (local_2c = 0; local_2c < local_c; local_2c = local_2c + 1) {
    bitstream_put_bits_8
              (&local_28,
               (byte)((int)(uint)*(byte *)(local_18 + (ulong)local_2c) >> 1) |
               (*(byte *)(local_18 + (ulong)local_2c) & 1) << 1,2);
  }
  return (uint)(local_28.position + 7 >> 3);
}

Assistant:

static unsigned int collapse_challenge(uint8_t* collapsed, unsigned int num_rounds,
                                       const uint8_t* challenge) {
  bitstream_t bs;
  bs.buffer.w = collapsed;
  bs.position = 0;

  for (unsigned int i = 0; i < num_rounds; ++i) {
    // flip challenge bits according to spec
    bitstream_put_bits_8(&bs, (challenge[i] >> 1) | ((challenge[i] & 1) << 1), 2);
  }

  return (bs.position + 7) / 8;
}